

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void update_txfm_count(MACROBLOCK *x,MACROBLOCKD *xd,FRAME_COUNTS *counts,TX_SIZE tx_size,int depth,
                      int blk_row,int blk_col,uint8_t allow_update_cdf)

{
  uint *puVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  MB_MODE_INFO *pMVar9;
  TXFM_CONTEXT *pTVar10;
  TXFM_CONTEXT *pTVar11;
  FRAME_CONTEXT *pFVar12;
  uint uVar13;
  uint uVar14;
  undefined7 in_register_00000009;
  TX_SIZE TVar15;
  TX_SIZE TVar16;
  byte bVar17;
  uint __c;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int col;
  uint __c_00;
  int iVar21;
  ulong uVar22;
  long lVar23;
  int offsetr;
  
  pMVar9 = *xd->mi;
  BVar2 = pMVar9->bsize;
  bVar3 = block_size_high[BVar2];
  uVar13 = (uint)bVar3;
  if (xd->mb_to_bottom_edge < 0) {
    uVar13 = (xd->mb_to_bottom_edge >> ((char)xd->plane[0].subsampling_y + 3U & 0x1f)) + uVar13;
  }
  bVar17 = block_size_wide[BVar2];
  uVar14 = (uint)bVar17;
  if (xd->mb_to_right_edge < 0) {
    uVar14 = (xd->mb_to_right_edge >> ((char)xd->plane[0].subsampling_x + 3U & 0x1f)) + uVar14;
  }
  pTVar10 = xd->above_txfm_context;
  pTVar11 = xd->left_txfm_context;
  TVar15 = (TX_SIZE)counts;
  uVar19 = (ulong)counts & 0xff;
  uVar22 = (ulong)(uint)((int)uVar19 * 4);
  __c_00 = (uint)*(byte *)((long)tx_size_wide + uVar22);
  __c = (uint)*(byte *)((long)tx_size_high + uVar22);
  if (TVar15 == '\0') {
    lVar23 = 0;
  }
  else {
    if (bVar3 < bVar17) {
      bVar3 = bVar17;
    }
    bVar17 = 1;
    uVar22 = 0x3f;
    if (bVar3 < 0x20) {
      if (bVar3 == 8) {
        TVar16 = '\x01';
        bVar17 = 0;
      }
      else {
        if (bVar3 != 0x10) goto LAB_001f9240;
        TVar16 = '\x02';
      }
LAB_001f9219:
      uVar22 = (ulong)(byte)(((""[uVar19] != TVar16 & bVar17) + TVar16 * -2) * '\x03' + 0x18);
    }
    else {
      TVar16 = '\x04';
      if ((bVar3 == 0x80) || (bVar3 == 0x40)) goto LAB_001f9219;
      if (bVar3 == 0x20) {
        TVar16 = '\x03';
        goto LAB_001f9219;
      }
    }
LAB_001f9240:
    lVar23 = (ulong)(pTVar11[depth] < __c) + (ulong)(pTVar10[blk_row] < __c_00) + uVar22;
  }
  if (((int)uVar13 >> 2 <= depth) || ((int)uVar14 >> 2 <= blk_row)) {
    return;
  }
  if ((int)CONCAT71(in_register_00000009,tx_size) == 2) {
    pMVar9->tx_size = TVar15;
  }
  else {
    iVar20 = (blk_row >> (av1_get_txb_size_index_tw_w_log2_table[BVar2] & 0x1f)) +
             ((depth >> (av1_get_txb_size_index_tw_h_log2_table[BVar2] & 0x1f)) <<
             (av1_get_txb_size_index_stride_log2_table[BVar2] & 0x1f));
    if (pMVar9->inter_tx_size[iVar20] != TVar15) {
      bVar3 = ""[uVar19];
      uVar22 = (ulong)((uint)bVar3 * 4);
      iVar6 = *(int *)((long)tx_size_wide_unit + uVar22);
      iVar7 = *(int *)((long)tx_size_high_unit + uVar22);
      if ((char)blk_col != '\0') {
        pFVar12 = xd->tile_ctx;
        uVar4 = pFVar12->txfm_partition_cdf[lVar23][2];
        uVar5 = pFVar12->txfm_partition_cdf[lVar23][0];
        pFVar12->txfm_partition_cdf[lVar23][0] =
             (short)((int)(0x8000 - (uint)uVar5) >> ((char)(uVar4 >> 4) + 4U & 0x1f)) + uVar5;
        pFVar12->txfm_partition_cdf[lVar23][2] = uVar4 + (uVar4 < 0x20);
      }
      puVar1 = &(x->txfm_search_info).txb_split_count;
      *puVar1 = *puVar1 + 1;
      if ((99UL >> ((ulong)counts & 0x3f) & 1) == 0) {
        uVar22 = (ulong)(uint)((int)uVar19 * 4);
        iVar20 = *(int *)((long)tx_size_high_unit + uVar22);
        iVar8 = *(int *)((long)tx_size_wide_unit + uVar22);
        iVar18 = 0;
        do {
          iVar21 = 0;
          do {
            update_txfm_count(x,xd,(FRAME_COUNTS *)(ulong)bVar3,tx_size + '\x01',depth + iVar18,
                              blk_row + iVar21,blk_col & 0xff,(uint8_t)iVar20);
            iVar21 = iVar21 + iVar6;
          } while (iVar21 < iVar8);
          iVar18 = iVar18 + iVar7;
        } while (iVar18 < iVar20);
        return;
      }
      pMVar9->inter_tx_size[iVar20] = '\0';
      pMVar9->tx_size = '\0';
      pTVar10 = xd->above_txfm_context;
      bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [txsize_to_bsize[uVar19]];
      memset(xd->left_txfm_context + depth,4,
             (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [txsize_to_bsize[uVar19]] +
                     (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [txsize_to_bsize[uVar19]] == 0) & 0xff));
      uVar13 = (uint)bVar3 + (uint)(bVar3 == 0);
      __c_00 = 4;
      goto LAB_001f9378;
    }
    if ((char)blk_col != '\0') {
      pFVar12 = xd->tile_ctx;
      uVar4 = pFVar12->txfm_partition_cdf[lVar23][2];
      uVar5 = pFVar12->txfm_partition_cdf[lVar23][0];
      pFVar12->txfm_partition_cdf[lVar23][0] = uVar5 - (uVar5 >> ((char)(uVar4 >> 4) + 4U & 0x1f));
      pFVar12->txfm_partition_cdf[lVar23][2] = uVar4 + (uVar4 < 0x20);
    }
    pMVar9->tx_size = TVar15;
  }
  bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [txsize_to_bsize[uVar19]];
  memset(pTVar11 + depth,__c,
         (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [txsize_to_bsize[uVar19]] +
                 (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [txsize_to_bsize[uVar19]] == 0) & 0xff));
  uVar13 = (uint)bVar3 + (uint)(bVar3 == 0);
LAB_001f9378:
  memset(pTVar10 + blk_row,__c_00,(ulong)(uVar13 & 0xff));
  return;
}

Assistant:

static void update_txfm_count(MACROBLOCK *x, MACROBLOCKD *xd,
                              FRAME_COUNTS *counts, TX_SIZE tx_size, int depth,
                              int blk_row, int blk_col,
                              uint8_t allow_update_cdf) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  int ctx = txfm_partition_context(xd->above_txfm_context + blk_col,
                                   xd->left_txfm_context + blk_row, mbmi->bsize,
                                   tx_size);
  const int txb_size_index = av1_get_txb_size_index(bsize, blk_row, blk_col);
  const TX_SIZE plane_tx_size = mbmi->inter_tx_size[txb_size_index];

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;
  assert(tx_size > TX_4X4);

  if (depth == MAX_VARTX_DEPTH) {
    // Don't add to counts in this case
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    return;
  }

  if (tx_size == plane_tx_size) {
#if CONFIG_ENTROPY_STATS
    ++counts->txfm_partition[ctx][0];
#endif
    if (allow_update_cdf)
      update_cdf(xd->tile_ctx->txfm_partition_cdf[ctx], 0, 2);
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];

#if CONFIG_ENTROPY_STATS
    ++counts->txfm_partition[ctx][1];
#endif
    if (allow_update_cdf)
      update_cdf(xd->tile_ctx->txfm_partition_cdf[ctx], 1, 2);
    ++x->txfm_search_info.txb_split_count;

    if (sub_txs == TX_4X4) {
      mbmi->inter_tx_size[txb_size_index] = TX_4X4;
      mbmi->tx_size = TX_4X4;
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, TX_4X4, tx_size);
      return;
    }

    for (int row = 0; row < tx_size_high_unit[tx_size]; row += bsh) {
      for (int col = 0; col < tx_size_wide_unit[tx_size]; col += bsw) {
        int offsetr = row;
        int offsetc = col;

        update_txfm_count(x, xd, counts, sub_txs, depth + 1, blk_row + offsetr,
                          blk_col + offsetc, allow_update_cdf);
      }
    }
  }
}